

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O2

string * __thiscall cmCTestBZR::LoadInfo_abi_cxx11_(string *__return_storage_ptr__,cmCTestBZR *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  allocator_type local_851;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_revno;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bzr_info;
  string local_820;
  string local_800;
  string bzr;
  OutputLogger rerr;
  OutputLogger ierr;
  RevnoParser rout;
  InfoParser iout;
  
  std::__cxx11::string::string
            ((string *)&bzr,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool
            );
  std::__cxx11::string::string((string *)&iout,(string *)&bzr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iout.super_LineParser.Line._M_string_length,"info",(allocator<char> *)&rout)
  ;
  __l._M_len = 2;
  __l._M_array = (iterator)&iout;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&bzr_info,__l,(allocator_type *)&ierr);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)((long)iout.RegexCheckOut.regmatch.startp + lVar1 + -0x50));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  InfoParser::InfoParser(&iout,this,"info-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&ierr,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"info-err> ");
  local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
  local_800._M_string_length = 0;
  local_800.field_2._M_local_buf[0] = '\0';
  cmCTestVC::RunChild((cmCTestVC *)this,&bzr_info,(OutputParser *)&iout,(OutputParser *)&ierr,
                      &local_800,Auto);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::string((string *)&rout,(string *)&bzr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rout.super_LineParser.Line._M_string_length,"revno",(allocator<char> *)&rerr
            );
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&rout;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&bzr_revno,__l_00,&local_851);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)rout.RegexRevno.regmatch.startp + lVar1 + -0x48))
    ;
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  RevnoParser::RevnoParser(&rout,this,"revno-out> ",__return_storage_ptr__);
  cmProcessTools::OutputLogger::OutputLogger
            (&rerr,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"revno-err> ");
  local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
  local_820._M_string_length = 0;
  local_820.field_2._M_local_buf[0] = '\0';
  cmCTestVC::RunChild((cmCTestVC *)this,&bzr_revno,(OutputParser *)&rout,(OutputParser *)&rerr,
                      &local_820,Auto);
  std::__cxx11::string::~string((string *)&local_820);
  cmProcessTools::LineParser::~LineParser(&rerr.super_LineParser);
  RevnoParser::~RevnoParser(&rout);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bzr_revno);
  cmProcessTools::LineParser::~LineParser(&ierr.super_LineParser);
  InfoParser::~InfoParser(&iout);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&bzr_info);
  std::__cxx11::string::~string((string *)&bzr);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestBZR::LoadInfo()
{
  // Run "bzr info" to get the repository info from the work tree.
  std::string bzr = this->CommandLineTool;
  std::vector<std::string> bzr_info = { bzr, "info" };
  InfoParser iout(this, "info-out> ");
  OutputLogger ierr(this->Log, "info-err> ");
  this->RunChild(bzr_info, &iout, &ierr);

  // Run "bzr revno" to get the repository revision number from the work tree.
  std::vector<std::string> bzr_revno = { bzr, "revno" };
  std::string rev;
  RevnoParser rout(this, "revno-out> ", rev);
  OutputLogger rerr(this->Log, "revno-err> ");
  this->RunChild(bzr_revno, &rout, &rerr);

  return rev;
}